

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_portal.cpp
# Opt level: O3

void __thiscall GLPortal::DrawPortalStencil(GLPortal *this)

{
  uint *puVar1;
  uint amount;
  int iVar2;
  GLWall *pGVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  
  if ((this->mPrimIndices).Count == 0) {
    uVar5 = (this->lines).Count;
    amount = uVar5 * 2;
    if (amount != 0) {
      TArray<unsigned_int,_unsigned_int>::Grow(&this->mPrimIndices,amount);
      uVar5 = (this->lines).Count;
    }
    (this->mPrimIndices).Count = amount;
    if (uVar5 != 0) {
      pGVar3 = (this->lines).Array;
      uVar6 = 1;
      lVar7 = 0;
      uVar4 = 0;
      do {
        if (gl.buffermethod != 1) {
          GLWall::MakeVertices((GLWall *)((long)pGVar3->vertexes + lVar7 + -0x18),false);
          pGVar3 = (this->lines).Array;
        }
        puVar1 = (this->mPrimIndices).Array;
        puVar1[(int)uVar6 - 1] = *(uint *)((long)pGVar3->zfloor + lVar7 + 8);
        puVar1[uVar6] = *(uint *)((long)pGVar3->zfloor + lVar7 + 0xc);
        uVar4 = uVar4 + 1;
        lVar7 = lVar7 + 0x140;
        uVar6 = (ulong)((int)uVar6 + 2);
      } while (uVar4 < (this->lines).Count);
    }
  }
  FRenderState::Apply(&gl_RenderState);
  if ((this->mPrimIndices).Count != 0) {
    uVar4 = 0;
    do {
      puVar1 = (this->mPrimIndices).Array;
      (*_ptrc_glDrawArrays)(6,puVar1[uVar4],puVar1[(int)uVar4 + 1]);
      uVar5 = (int)uVar4 + 2;
      uVar4 = (ulong)uVar5;
    } while (uVar5 < (this->mPrimIndices).Count);
  }
  iVar2 = (*this->_vptr_GLPortal[5])(this);
  if (((char)iVar2 != '\0') && (1 < (this->lines).Count)) {
    (*_ptrc_glDrawArrays)(6,0xc,4);
    (*_ptrc_glDrawArrays)(6,0x10,4);
    return;
  }
  return;
}

Assistant:

void GLPortal::DrawPortalStencil()
{
	if (mPrimIndices.Size() == 0)
	{
		mPrimIndices.Resize(2 * lines.Size());

		for (unsigned int i = 0; i < lines.Size(); i++)
		{
			if (gl.buffermethod != BM_DEFERRED) lines[i].MakeVertices(false);
			mPrimIndices[i * 2] = lines[i].vertindex;
			mPrimIndices[i * 2 + 1] = lines[i].vertcount;
		}
	}
	gl_RenderState.Apply();
	for (unsigned int i = 0; i < mPrimIndices.Size(); i += 2)
	{
		GLRenderer->mVBO->RenderArray(GL_TRIANGLE_FAN, mPrimIndices[i], mPrimIndices[i + 1]);
	}
	if (NeedCap() && lines.Size() > 1)
	{
		GLRenderer->mVBO->RenderArray(GL_TRIANGLE_FAN, FFlatVertexBuffer::STENCILTOP_INDEX, 4);
		GLRenderer->mVBO->RenderArray(GL_TRIANGLE_FAN, FFlatVertexBuffer::STENCILBOTTOM_INDEX, 4);
	}
}